

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O3

void duckdb::AggregateExecutor::
     UnaryScatter<duckdb::BitState<unsigned_short>,short,duckdb::BitXorOperation>
               (Vector *input,Vector *states,AggregateInputData *aggr_input_data,idx_t count)

{
  ushort *puVar1;
  byte *pbVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  long lVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  ushort uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  idx_t iVar14;
  idx_t iVar15;
  idx_t iVar16;
  ulong uVar17;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat sdata;
  long *local_b8;
  long local_b0;
  long local_a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_78;
  long *local_70;
  long local_68;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  
  if (*input == (Vector)0x0) {
    if (*states == (Vector)0x0) {
      lVar3 = *(long *)(input + 0x20);
      lVar4 = *(long *)(states + 0x20);
      FlatVector::VerifyFlatVector(input);
      lVar6 = *(long *)(input + 0x28);
      if (lVar6 == 0) {
        if (count == 0) {
          return;
        }
        iVar14 = 0;
        do {
          pcVar5 = *(char **)(lVar4 + iVar14 * 8);
          uVar10 = *(ushort *)(lVar3 + iVar14 * 2);
          if (*pcVar5 == '\0') {
            *pcVar5 = '\x01';
          }
          else {
            uVar10 = uVar10 ^ *(ushort *)(pcVar5 + 2);
          }
          *(ushort *)(pcVar5 + 2) = uVar10;
          iVar14 = iVar14 + 1;
        } while (count != iVar14);
        return;
      }
      if (count + 0x3f < 0x40) {
        return;
      }
      uVar9 = 0;
      uVar12 = 0;
      do {
        uVar7 = *(ulong *)(lVar6 + uVar9 * 8);
        uVar11 = uVar12 + 0x40;
        if (count <= uVar12 + 0x40) {
          uVar11 = count;
        }
        uVar13 = uVar11;
        if (uVar7 != 0) {
          uVar13 = uVar12;
          if (uVar7 == 0xffffffffffffffff) {
            if (uVar12 < uVar11) {
              do {
                pcVar5 = *(char **)(lVar4 + uVar12 * 8);
                uVar10 = *(ushort *)(lVar3 + uVar12 * 2);
                if (*pcVar5 == '\0') {
                  *pcVar5 = '\x01';
                }
                else {
                  uVar10 = uVar10 ^ *(ushort *)(pcVar5 + 2);
                }
                *(ushort *)(pcVar5 + 2) = uVar10;
                uVar12 = uVar12 + 1;
                uVar13 = uVar11;
              } while (uVar11 != uVar12);
            }
          }
          else if (uVar12 < uVar11) {
            uVar17 = 0;
            do {
              if ((uVar7 >> (uVar17 & 0x3f) & 1) != 0) {
                pcVar5 = *(char **)(lVar4 + uVar12 * 8 + uVar17 * 8);
                uVar10 = *(ushort *)(lVar3 + uVar12 * 2 + uVar17 * 2);
                if (*pcVar5 == '\0') {
                  *(ushort *)(pcVar5 + 2) = uVar10;
                  *pcVar5 = '\x01';
                }
                else {
                  *(ushort *)(pcVar5 + 2) = *(ushort *)(pcVar5 + 2) ^ uVar10;
                }
              }
              uVar17 = uVar17 + 1;
              uVar13 = uVar11;
            } while (uVar11 - uVar12 != uVar17);
          }
        }
        uVar9 = uVar9 + 1;
        uVar12 = uVar13;
      } while (uVar9 != count + 0x3f >> 6);
      return;
    }
  }
  else if ((*input == (Vector)0x2) && (*states == (Vector)0x2)) {
    if ((*(byte **)(input + 0x28) != (byte *)0x0) && ((**(byte **)(input + 0x28) & 1) == 0)) {
      return;
    }
    if (count == 0) {
      return;
    }
    puVar1 = *(ushort **)(input + 0x20);
    pbVar2 = (byte *)**(undefined8 **)(states + 0x20);
    bVar8 = *pbVar2;
    do {
      uVar10 = *puVar1;
      if ((bVar8 & 1) == 0) {
        *pbVar2 = 1;
        bVar8 = 1;
      }
      else {
        uVar10 = uVar10 ^ *(ushort *)(pbVar2 + 2);
      }
      *(ushort *)(pbVar2 + 2) = uVar10;
      count = count - 1;
    } while (count != 0);
    return;
  }
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_b8);
  duckdb::UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)&local_70);
  duckdb::Vector::ToUnifiedFormat((ulong)input,(UnifiedVectorFormat *)count);
  duckdb::Vector::ToUnifiedFormat((ulong)states,(UnifiedVectorFormat *)count);
  if (local_a8 == 0) {
    if (count != 0) {
      lVar3 = *local_b8;
      lVar4 = *local_70;
      iVar14 = 0;
      do {
        iVar15 = iVar14;
        if (lVar3 != 0) {
          iVar15 = (idx_t)*(uint *)(lVar3 + iVar14 * 4);
        }
        iVar16 = iVar14;
        if (lVar4 != 0) {
          iVar16 = (idx_t)*(uint *)(lVar4 + iVar14 * 4);
        }
        pcVar5 = *(char **)(local_68 + iVar16 * 8);
        uVar10 = *(ushort *)(local_b0 + iVar15 * 2);
        if (*pcVar5 == '\0') {
          *pcVar5 = '\x01';
        }
        else {
          uVar10 = uVar10 ^ *(ushort *)(pcVar5 + 2);
        }
        *(ushort *)(pcVar5 + 2) = uVar10;
        iVar14 = iVar14 + 1;
      } while (count != iVar14);
    }
  }
  else if (count != 0) {
    lVar3 = *local_b8;
    lVar4 = *local_70;
    iVar14 = 0;
    do {
      iVar15 = iVar14;
      if (lVar3 != 0) {
        iVar15 = (idx_t)*(uint *)(lVar3 + iVar14 * 4);
      }
      iVar16 = iVar14;
      if (lVar4 != 0) {
        iVar16 = (idx_t)*(uint *)(lVar4 + iVar14 * 4);
      }
      if ((*(ulong *)(local_a8 + (iVar15 >> 6) * 8) >> (iVar15 & 0x3f) & 1) != 0) {
        pcVar5 = *(char **)(local_68 + iVar16 * 8);
        uVar10 = *(ushort *)(local_b0 + iVar15 * 2);
        if (*pcVar5 == '\0') {
          *(ushort *)(pcVar5 + 2) = uVar10;
          *pcVar5 = '\x01';
        }
        else {
          *(ushort *)(pcVar5 + 2) = *(ushort *)(pcVar5 + 2) ^ uVar10;
        }
      }
      iVar14 = iVar14 + 1;
    } while (count != iVar14);
  }
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  if (local_78 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_78);
  }
  if (local_98 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_98);
  }
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}